

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O1

void print_table_object(flatcc_json_printer_t *ctx,void *p,int ttl,flatcc_json_printer_table_f *pf)

{
  long lVar1;
  char *pcVar2;
  size_t __n;
  size_t __n_00;
  flatcc_json_printer_table_descriptor_t td;
  flatcc_json_printer_table_descriptor_t local_38;
  
  local_38.ttl = ttl + -1;
  if (local_38.ttl == 0) {
    if (ctx->error == 0) {
      ctx->error = 2;
    }
  }
  else {
    ctx->level = ctx->level + 1;
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '{';
    local_38.count = 0;
    local_38.vtable = (void *)((long)p - (long)*p);
    local_38.vsize = (int)*local_38.vtable;
    local_38.table = p;
    (*pf)(ctx,&local_38);
    if (ctx->indent != '\0') {
      pcVar2 = ctx->p;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '\n';
      lVar1 = (long)ctx->level + -1;
      ctx->level = (int)lVar1;
      __n = (ulong)ctx->indent * lVar1;
      pcVar2 = ctx->p;
      if (ctx->pflush < pcVar2 + __n) {
        if (ctx->pflush <= pcVar2) {
          (*ctx->flush)(ctx,0);
        }
        __n_00 = (long)ctx->pflush - (long)ctx->p;
        if (__n_00 < __n) {
          do {
            memset(ctx->p,0x20,__n_00);
            ctx->p = ctx->p + __n_00;
            __n = __n - __n_00;
            (*ctx->flush)(ctx,0);
            __n_00 = (long)ctx->pflush - (long)ctx->p;
          } while (__n_00 < __n);
        }
        pcVar2 = ctx->p;
      }
      memset(pcVar2,0x20,__n);
      ctx->p = ctx->p + __n;
    }
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = '}';
  }
  return;
}

Assistant:

static inline void print_table_object(flatcc_json_printer_t *ctx,
        const void *p, int ttl, flatcc_json_printer_table_f pf)
{
    flatcc_json_printer_table_descriptor_t td;

    if (!--ttl) {
        flatcc_json_printer_set_error(ctx, flatcc_json_printer_error_deep_recursion);
        return;
    }
    print_start('{');
    td.count = 0;
    td.ttl = ttl;
    td.table = p;
    td.vtable = (uint8_t *)p - __flatbuffers_soffset_read_from_pe(p);
    td.vsize = __flatbuffers_voffset_read_from_pe(td.vtable);
    pf(ctx, &td);
    print_end('}');
}